

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Type * __thiscall soul::heart::Parser::readValueOrRefType(Type *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  Type t;
  Type local_28;
  
  readValueType(&local_28,this);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2a35ee);
  if (bVar1) {
    Type::createReference(__return_storage_ptr__,&local_28);
  }
  else {
    __return_storage_ptr__->category = local_28.category;
    __return_storage_ptr__->arrayElementCategory = local_28.arrayElementCategory;
    __return_storage_ptr__->isRef = local_28.isRef;
    __return_storage_ptr__->isConstant = local_28.isConstant;
    __return_storage_ptr__->primitiveType = (PrimitiveType)local_28.primitiveType.type;
    __return_storage_ptr__->boundingSize = local_28.boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = local_28.arrayElementBoundingSize;
    (__return_storage_ptr__->structure).object = local_28.structure.object;
    local_28.structure.object = (Structure *)0x0;
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_28.structure.object);
  return __return_storage_ptr__;
}

Assistant:

Type readValueOrRefType()
    {
        auto t = readValueType();

        if (matchIf (HEARTOperator::bitwiseAnd))
            return t.createReference();

        return t;
    }